

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

double __thiscall
icu_63::NFRule::matchToDelimiter
          (NFRule *this,UnicodeString *text,int32_t startPos,double _baseValue,
          UnicodeString *delimiter,ParsePosition *pp,NFSubstitution *sub,
          uint32_t nonNumericalExecutedRuleMask,double upperBound)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  int iVar4;
  undefined1 local_1b8 [7];
  UBool success_1;
  Formattable result_1;
  ParsePosition tempPP_1;
  undefined1 local_130 [7];
  UBool success;
  UnicodeString subText;
  int local_e8;
  int32_t dPos;
  int32_t dLen;
  undefined1 local_d8 [8];
  Formattable result;
  ParsePosition tempPP;
  UErrorCode status;
  double upperBound_local;
  NFSubstitution *sub_local;
  ParsePosition *pp_local;
  UnicodeString *delimiter_local;
  double _baseValue_local;
  int32_t startPos_local;
  UnicodeString *text_local;
  NFRule *this_local;
  
  tempPP.errorIndex = 0;
  UVar2 = allIgnorable(this,delimiter,&tempPP.errorIndex);
  if (UVar2 == '\0') {
    UVar2 = ::U_FAILURE(tempPP.errorIndex);
    if (UVar2 == '\0') {
      ParsePosition::ParsePosition((ParsePosition *)((long)&result.fBogus.fUnion + 0x30));
      Formattable::Formattable((Formattable *)local_d8);
      subText.fUnion._52_4_ = findText(this,text,delimiter,startPos,&local_e8);
      do {
        if ((int)subText.fUnion._52_4_ < 0) {
          ParsePosition::setIndex(pp,0);
          this_local = (NFRule *)0x0;
          break;
        }
        icu_63::UnicodeString::UnicodeString((UnicodeString *)local_130);
        icu_63::UnicodeString::setTo((UnicodeString *)local_130,text,0,subText.fUnion._52_4_);
        iVar3 = icu_63::UnicodeString::length((UnicodeString *)local_130);
        if (iVar3 < 1) {
LAB_003b8f57:
          ParsePosition::setIndex((ParsePosition *)((long)&result.fBogus.fUnion + 0x30),0);
          subText.fUnion._52_4_ =
               findText(this,text,delimiter,subText.fUnion._52_4_ + local_e8,&local_e8);
          bVar1 = false;
        }
        else {
          iVar4 = (*(this->formatter->super_NumberFormat).super_Format.super_UObject._vptr_UObject
                    [0x19])();
          iVar4 = (*(sub->super_UObject)._vptr_UObject[10])
                            (_baseValue,upperBound,sub,local_130,
                             (undefined1 *)((long)&result.fBogus.fUnion + 0x30),
                             (ulong)(uint)(int)(char)iVar4,(ulong)nonNumericalExecutedRuleMask,
                             local_d8);
          if (((char)iVar4 == '\0') ||
             (iVar3 = ParsePosition::getIndex((ParsePosition *)((long)&result.fBogus.fUnion + 0x30))
             , iVar3 != subText.fUnion._52_4_)) {
            iVar3 = ParsePosition::getErrorIndex
                              ((ParsePosition *)((long)&result.fBogus.fUnion + 0x30));
            if (iVar3 < 1) {
              iVar3 = ParsePosition::getIndex((ParsePosition *)((long)&result.fBogus.fUnion + 0x30))
              ;
              ParsePosition::setErrorIndex(pp,iVar3);
            }
            else {
              iVar3 = ParsePosition::getErrorIndex
                                ((ParsePosition *)((long)&result.fBogus.fUnion + 0x30));
              ParsePosition::setErrorIndex(pp,iVar3);
            }
            goto LAB_003b8f57;
          }
          ParsePosition::setIndex(pp,subText.fUnion._52_4_ + local_e8);
          this_local = (NFRule *)Formattable::getDouble((Formattable *)local_d8);
          bVar1 = true;
        }
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_130);
      } while (!bVar1);
      Formattable::~Formattable((Formattable *)local_d8);
      ParsePosition::~ParsePosition((ParsePosition *)((long)&result.fBogus.fUnion + 0x30));
    }
    else {
      this_local = (NFRule *)0x0;
    }
  }
  else {
    this_local = (NFRule *)_baseValue;
    if (sub != (NFSubstitution *)0x0) {
      ParsePosition::ParsePosition((ParsePosition *)((long)&result_1.fBogus.fUnion + 0x30));
      Formattable::Formattable((Formattable *)local_1b8);
      iVar4 = (*(this->formatter->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x19]
              )();
      iVar4 = (*(sub->super_UObject)._vptr_UObject[10])
                        (_baseValue,upperBound,sub,text,
                         (undefined1 *)((long)&result_1.fBogus.fUnion + 0x30),
                         (ulong)(uint)(int)(char)iVar4,(ulong)nonNumericalExecutedRuleMask,local_1b8
                        );
      if (((char)iVar4 == '\0') ||
         (iVar3 = ParsePosition::getIndex((ParsePosition *)((long)&result_1.fBogus.fUnion + 0x30)),
         iVar3 == 0)) {
        iVar3 = ParsePosition::getErrorIndex
                          ((ParsePosition *)((long)&result_1.fBogus.fUnion + 0x30));
        ParsePosition::setErrorIndex(pp,iVar3);
        this_local = (NFRule *)0x0;
      }
      else {
        iVar3 = ParsePosition::getIndex((ParsePosition *)((long)&result_1.fBogus.fUnion + 0x30));
        ParsePosition::setIndex(pp,iVar3);
        this_local = (NFRule *)Formattable::getDouble((Formattable *)local_1b8);
      }
      Formattable::~Formattable((Formattable *)local_1b8);
      ParsePosition::~ParsePosition((ParsePosition *)((long)&result_1.fBogus.fUnion + 0x30));
    }
  }
  return (double)this_local;
}

Assistant:

double
NFRule::matchToDelimiter(const UnicodeString& text,
                         int32_t startPos,
                         double _baseValue,
                         const UnicodeString& delimiter,
                         ParsePosition& pp,
                         const NFSubstitution* sub,
                         uint32_t nonNumericalExecutedRuleMask,
                         double upperBound) const
{
	UErrorCode status = U_ZERO_ERROR;
    // if "delimiter" contains real (i.e., non-ignorable) text, search
    // it for "delimiter" beginning at "start".  If that succeeds, then
    // use "sub"'s doParse() method to match the text before the
    // instance of "delimiter" we just found.
    if (!allIgnorable(delimiter, status)) {
    	if (U_FAILURE(status)) { //Memory allocation error.
    		return 0;
    	}
        ParsePosition tempPP;
        Formattable result;

        // use findText() to search for "delimiter".  It returns a two-
        // element array: element 0 is the position of the match, and
        // element 1 is the number of characters that matched
        // "delimiter".
        int32_t dLen;
        int32_t dPos = findText(text, delimiter, startPos, &dLen);

        // if findText() succeeded, isolate the text preceding the
        // match, and use "sub" to match that text
        while (dPos >= 0) {
            UnicodeString subText;
            subText.setTo(text, 0, dPos);
            if (subText.length() > 0) {
                UBool success = sub->doParse(subText, tempPP, _baseValue, upperBound,
#if UCONFIG_NO_COLLATION
                    FALSE,
#else
                    formatter->isLenient(),
#endif
                    nonNumericalExecutedRuleMask,
                    result);

                // if the substitution could match all the text up to
                // where we found "delimiter", then this function has
                // a successful match.  Bump the caller's parse position
                // to point to the first character after the text
                // that matches "delimiter", and return the result
                // we got from parsing the substitution.
                if (success && tempPP.getIndex() == dPos) {
                    pp.setIndex(dPos + dLen);
                    return result.getDouble();
                }
                else {
                    // commented out because ParsePosition doesn't have error index in 1.1.x
                    // restored for ICU4C port
                    if (tempPP.getErrorIndex() > 0) {
                        pp.setErrorIndex(tempPP.getErrorIndex());
                    } else {
                        pp.setErrorIndex(tempPP.getIndex());
                    }
                }
            }

            // if we didn't match the substitution, search for another
            // copy of "delimiter" in "text" and repeat the loop if
            // we find it
            tempPP.setIndex(0);
            dPos = findText(text, delimiter, dPos + dLen, &dLen);
        }
        // if we make it here, this was an unsuccessful match, and we
        // leave pp unchanged and return 0
        pp.setIndex(0);
        return 0;

        // if "delimiter" is empty, or consists only of ignorable characters
        // (i.e., is semantically empty), thwe we obviously can't search
        // for "delimiter".  Instead, just use "sub" to parse as much of
        // "text" as possible.
    }
    else if (sub == NULL) {
        return _baseValue;
    }
    else {
        ParsePosition tempPP;
        Formattable result;

        // try to match the whole string against the substitution
        UBool success = sub->doParse(text, tempPP, _baseValue, upperBound,
#if UCONFIG_NO_COLLATION
            FALSE,
#else
            formatter->isLenient(),
#endif
            nonNumericalExecutedRuleMask,
            result);
        if (success && (tempPP.getIndex() != 0)) {
            // if there's a successful match (or it's a null
            // substitution), update pp to point to the first
            // character we didn't match, and pass the result from
            // sub.doParse() on through to the caller
            pp.setIndex(tempPP.getIndex());
            return result.getDouble();
        }
        else {
            // commented out because ParsePosition doesn't have error index in 1.1.x
            // restored for ICU4C port
            pp.setErrorIndex(tempPP.getErrorIndex());
        }

        // and if we get to here, then nothing matched, so we return
        // 0 and leave pp alone
        return 0;
    }
}